

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EditorInterface.cpp
# Opt level: O0

shared_ptr<gui::DialogBox> __thiscall EditorInterface::createOverwriteDialog(EditorInterface *this)

{
  element_type *peVar1;
  element_type *locale;
  element_type *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  EditorInterface *in_RSI;
  element_type *in_RDI;
  shared_ptr<gui::DialogBox> sVar3;
  shared_ptr<gui::Button> overwriteCancelButton;
  shared_ptr<gui::Button> overwriteSubmitButton;
  shared_ptr<gui::Label> overwriteLabel;
  shared_ptr<gui::Label> overwriteTitle;
  element_type *overwriteDialogPtr;
  shared_ptr<gui::DialogBox> *overwriteDialog;
  float in_stack_fffffffffffffc88;
  float in_stack_fffffffffffffc8c;
  Button *in_stack_fffffffffffffc90;
  anon_class_16_2_8d71aab6 *in_stack_fffffffffffffc98;
  locale *in_stack_fffffffffffffcd0;
  char *in_stack_fffffffffffffcd8;
  locale *this_01;
  String *in_stack_fffffffffffffce0;
  DialogBox *this_02;
  shared_ptr<gui::Label> *in_stack_fffffffffffffce8;
  DialogBox *in_stack_fffffffffffffcf0;
  Theme *in_stack_fffffffffffffcf8;
  Theme *theme;
  element_type *widget;
  locale local_260 [40];
  locale local_238 [88];
  locale local_1e0 [40];
  undefined1 local_1b8 [88];
  locale local_160 [40];
  locale local_138 [88];
  locale local_e0 [40];
  locale local_b8 [72];
  element_type *local_70;
  Vector2<float> local_64 [2];
  locale local_50 [63];
  byte local_11;
  
  local_11 = 0;
  widget = in_RDI;
  std::unique_ptr<gui::Theme,_std::default_delete<gui::Theme>_>::operator*
            ((unique_ptr<gui::Theme,_std::default_delete<gui::Theme>_> *)in_stack_fffffffffffffc90);
  std::locale::locale(local_50);
  sf::String::String(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0);
  ::gui::DialogBox::create(in_stack_fffffffffffffcf8,(String *)in_stack_fffffffffffffcf0);
  debugWidgetCreation<gui::DialogBox>(in_RSI,(shared_ptr<gui::DialogBox> *)widget);
  std::shared_ptr<gui::DialogBox>::~shared_ptr((shared_ptr<gui::DialogBox> *)0x1ac2c1);
  sf::String::~String((String *)0x1ac2ce);
  std::locale::~locale(local_50);
  std::__shared_ptr_access<gui::DialogBox,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<gui::DialogBox,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1ac2e8);
  sf::Vector2<float>::Vector2(local_64,450.0,100.0);
  ::gui::DialogBox::setSize
            ((DialogBox *)in_stack_fffffffffffffc90,
             (Vector2f *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
  peVar1 = std::__shared_ptr_access<gui::DialogBox,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<gui::DialogBox,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1ac333);
  (*(peVar1->super_Group).super_Container.super_ContainerBase._vptr_ContainerBase[3])(peVar1,0);
  local_70 = std::__shared_ptr<gui::DialogBox,_(__gnu_cxx::_Lock_policy)2>::get
                       ((__shared_ptr<gui::DialogBox,_(__gnu_cxx::_Lock_policy)2> *)in_RDI);
  std::unique_ptr<gui::Theme,_std::default_delete<gui::Theme>_>::operator*
            ((unique_ptr<gui::Theme,_std::default_delete<gui::Theme>_> *)in_stack_fffffffffffffc90);
  std::locale::locale(local_b8);
  sf::String::String(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0);
  ::gui::Label::create(in_stack_fffffffffffffcf8,(String *)in_stack_fffffffffffffcf0);
  debugWidgetCreation<gui::Label>(in_RSI,(shared_ptr<gui::Label> *)widget);
  std::shared_ptr<gui::Label>::~shared_ptr((shared_ptr<gui::Label> *)0x1ac3f1);
  sf::String::~String((String *)0x1ac3fe);
  std::locale::~locale(local_b8);
  std::__shared_ptr_access<gui::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<gui::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x1ac418);
  std::locale::locale(local_e0);
  sf::String::String(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0);
  ::gui::Label::setLabel
            ((Label *)in_stack_fffffffffffffc90,
             (String *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
  sf::String::~String((String *)0x1ac477);
  std::locale::~locale(local_e0);
  std::__shared_ptr_access<gui::DialogBox,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<gui::DialogBox,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1ac491);
  std::shared_ptr<gui::Label>::shared_ptr
            ((shared_ptr<gui::Label> *)in_stack_fffffffffffffc90,
             (shared_ptr<gui::Label> *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88)
            );
  ::gui::DialogBox::setTitle(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
  std::shared_ptr<gui::Label>::~shared_ptr((shared_ptr<gui::Label> *)0x1ac4da);
  std::unique_ptr<gui::Theme,_std::default_delete<gui::Theme>_>::operator*
            ((unique_ptr<gui::Theme,_std::default_delete<gui::Theme>_> *)in_stack_fffffffffffffc90);
  std::locale::locale(local_138);
  sf::String::String(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0);
  ::gui::Label::create(in_stack_fffffffffffffcf8,(String *)in_stack_fffffffffffffcf0);
  debugWidgetCreation<gui::Label>(in_RSI,(shared_ptr<gui::Label> *)widget);
  std::shared_ptr<gui::Label>::~shared_ptr((shared_ptr<gui::Label> *)0x1ac573);
  sf::String::~String((String *)0x1ac580);
  std::locale::~locale(local_138);
  std::__shared_ptr_access<gui::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<gui::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x1ac59a);
  std::locale::locale(local_160);
  sf::String::String(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0);
  ::gui::Label::setLabel
            ((Label *)in_stack_fffffffffffffc90,
             (String *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
  sf::String::~String((String *)0x1ac5f3);
  std::locale::~locale(local_160);
  std::__shared_ptr_access<gui::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<gui::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x1ac60d);
  ::gui::Widget::setPosition
            (&in_stack_fffffffffffffc90->super_Widget,in_stack_fffffffffffffc8c,
             in_stack_fffffffffffffc88);
  peVar1 = std::__shared_ptr_access<gui::DialogBox,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<gui::DialogBox,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1ac634);
  theme = (Theme *)(local_1b8 + 0x48);
  std::shared_ptr<gui::Widget>::shared_ptr<gui::Label,void>
            ((shared_ptr<gui::Widget> *)in_stack_fffffffffffffc90,
             (shared_ptr<gui::Label> *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88)
            );
  (*(peVar1->super_Group).super_Container.super_ContainerBase._vptr_ContainerBase[2])(peVar1,theme);
  std::shared_ptr<gui::Widget>::~shared_ptr((shared_ptr<gui::Widget> *)0x1ac675);
  std::unique_ptr<gui::Theme,_std::default_delete<gui::Theme>_>::operator*
            ((unique_ptr<gui::Theme,_std::default_delete<gui::Theme>_> *)in_stack_fffffffffffffc90);
  this_02 = (DialogBox *)local_1b8;
  std::locale::locale((locale *)this_02);
  sf::String::String((String *)this_02,in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0);
  ::gui::Button::create(theme,(String *)peVar1);
  debugWidgetCreation<gui::Button>(in_RSI,(shared_ptr<gui::Button> *)widget);
  std::shared_ptr<gui::Button>::~shared_ptr((shared_ptr<gui::Button> *)0x1ac702);
  sf::String::~String((String *)0x1ac70f);
  std::locale::~locale((locale *)local_1b8);
  locale = std::__shared_ptr_access<gui::Button,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<gui::Button,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      0x1ac729);
  this_01 = local_1e0;
  std::locale::locale(this_01);
  sf::String::String((String *)this_02,(char *)this_01,(locale *)locale);
  ::gui::Button::setLabel
            (in_stack_fffffffffffffc90,
             (String *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
  sf::String::~String((String *)0x1ac77c);
  std::locale::~locale(local_1e0);
  std::__shared_ptr_access<gui::DialogBox,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<gui::DialogBox,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1ac796);
  std::shared_ptr<gui::Button>::shared_ptr
            ((shared_ptr<gui::Button> *)in_stack_fffffffffffffc90,
             (shared_ptr<gui::Button> *)
             CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
  ::gui::DialogBox::setSubmitButton(this_02,(size_t)this_01,(shared_ptr<gui::Button> *)locale);
  std::shared_ptr<gui::Button>::~shared_ptr((shared_ptr<gui::Button> *)0x1ac7d7);
  std::unique_ptr<gui::Theme,_std::default_delete<gui::Theme>_>::operator*
            ((unique_ptr<gui::Theme,_std::default_delete<gui::Theme>_> *)in_stack_fffffffffffffc90);
  std::locale::locale(local_238);
  sf::String::String((String *)this_02,(char *)this_01,(locale *)locale);
  ::gui::Button::create(theme,(String *)peVar1);
  debugWidgetCreation<gui::Button>(in_RSI,(shared_ptr<gui::Button> *)widget);
  std::shared_ptr<gui::Button>::~shared_ptr((shared_ptr<gui::Button> *)0x1ac864);
  sf::String::~String((String *)0x1ac871);
  std::locale::~locale(local_238);
  this_00 = std::__shared_ptr_access<gui::Button,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<gui::Button,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                       )0x1ac88b);
  std::locale::locale(local_260);
  sf::String::String((String *)this_02,(char *)this_01,(locale *)locale);
  ::gui::Button::setLabel
            (in_stack_fffffffffffffc90,
             (String *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
  sf::String::~String((String *)0x1ac8de);
  std::locale::~locale(local_260);
  std::__shared_ptr_access<gui::Button,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<gui::Button,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x1ac8f8)
  ;
  ::gui::Signal<gui::Widget*,sf::Vector2<float>const&>::
  connect<EditorInterface::createOverwriteDialog()const::__0>
            ((Signal<gui::Widget_*,_const_sf::Vector2<float>_&> *)this_00,in_stack_fffffffffffffc98)
  ;
  peVar1 = std::__shared_ptr_access<gui::DialogBox,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<gui::DialogBox,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1ac93e);
  std::shared_ptr<gui::Button>::shared_ptr
            ((shared_ptr<gui::Button> *)peVar1,
             (shared_ptr<gui::Button> *)
             CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
  ::gui::DialogBox::setCancelButton(this_02,(size_t)this_01,(shared_ptr<gui::Button> *)locale);
  std::shared_ptr<gui::Button>::~shared_ptr((shared_ptr<gui::Button> *)0x1ac980);
  local_11 = 1;
  std::shared_ptr<gui::Button>::~shared_ptr((shared_ptr<gui::Button> *)0x1ac995);
  std::shared_ptr<gui::Button>::~shared_ptr((shared_ptr<gui::Button> *)0x1ac9a2);
  std::shared_ptr<gui::Label>::~shared_ptr((shared_ptr<gui::Label> *)0x1ac9af);
  std::shared_ptr<gui::Label>::~shared_ptr((shared_ptr<gui::Label> *)0x1ac9bc);
  _Var2._M_pi = extraout_RDX;
  if ((local_11 & 1) == 0) {
    std::shared_ptr<gui::DialogBox>::~shared_ptr((shared_ptr<gui::DialogBox> *)0x1ace5c);
    _Var2._M_pi = extraout_RDX_00;
  }
  sVar3.super___shared_ptr<gui::DialogBox,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  sVar3.super___shared_ptr<gui::DialogBox,_(__gnu_cxx::_Lock_policy)2>._M_ptr = widget;
  return (shared_ptr<gui::DialogBox>)
         sVar3.super___shared_ptr<gui::DialogBox,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<gui::DialogBox> EditorInterface::createOverwriteDialog() const {
    auto overwriteDialog = debugWidgetCreation(gui::DialogBox::create(*theme_, "overwriteDialog"));
    overwriteDialog->setSize({450.0f, 100.0f});
    overwriteDialog->setVisible(false);
    auto overwriteDialogPtr = overwriteDialog.get();

    auto overwriteTitle = debugWidgetCreation(gui::Label::create(*theme_, "overwriteTitle"));
    overwriteTitle->setLabel("Overwrite File?");
    overwriteDialog->setTitle(overwriteTitle);

    auto overwriteLabel = debugWidgetCreation(gui::Label::create(*theme_, "overwriteLabel"));
    overwriteLabel->setLabel("The file already exists, do you want to replace it?");
    overwriteLabel->setPosition(10.0f, 30.0f);
    overwriteDialog->addChild(overwriteLabel);

    auto overwriteSubmitButton = debugWidgetCreation(gui::Button::create(*theme_, "overwriteSubmitButton"));
    overwriteSubmitButton->setLabel("Overwrite");
    overwriteDialog->setSubmitButton(0, overwriteSubmitButton);

    auto overwriteCancelButton = debugWidgetCreation(gui::Button::create(*theme_, "overwriteCancelButton"));
    overwriteCancelButton->setLabel("Cancel");
    overwriteCancelButton->onClick.connect([this,overwriteDialogPtr]() {
        overwriteDialogPtr->setVisible(false);
        modalBackground_->setVisible(false);
    });
    overwriteDialog->setCancelButton(1, overwriteCancelButton);

    return overwriteDialog;
}